

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O3

SquareMatrix<double> __thiscall qclab::dense::eye<double>(dense *this,int64_t size)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined8 *puVar3;
  __uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true> extraout_RDX;
  _Head_base<0UL,_double_*,_false> _Var4;
  _Head_base<0UL,_double_*,_false> _Var5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  SquareMatrix<double> SVar10;
  
  SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)this,size,0.0);
  auVar2 = _DAT_0011b040;
  _Var4._M_head_impl =
       (double *)
       extraout_RDX.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
       super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
       super__Head_base<0UL,_double_*,_false>._M_head_impl;
  if (0 < size) {
    lVar1 = *(long *)this;
    puVar3 = *(undefined8 **)(this + 8);
    _Var4._M_head_impl = (double *)(size + 1U & 0xfffffffffffffffe);
    lVar6 = size + -1;
    auVar7._8_4_ = (int)lVar6;
    auVar7._0_8_ = lVar6;
    auVar7._12_4_ = (int)((ulong)lVar6 >> 0x20);
    _Var5._M_head_impl = (double *)0x0;
    auVar7 = auVar7 ^ _DAT_0011b040;
    auVar8 = _DAT_0011b030;
    do {
      auVar9 = auVar8 ^ auVar2;
      if ((bool)(~(auVar9._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar9._0_4_ ||
                  auVar7._4_4_ < auVar9._4_4_) & 1)) {
        *puVar3 = 0x3ff0000000000000;
      }
      if ((auVar9._12_4_ != auVar7._12_4_ || auVar9._8_4_ <= auVar7._8_4_) &&
          auVar9._12_4_ <= auVar7._12_4_) {
        puVar3[lVar1 + 1] = 0x3ff0000000000000;
      }
      _Var5._M_head_impl = _Var5._M_head_impl + 2;
      lVar6 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar6 + 2;
      puVar3 = puVar3 + lVar1 * 2 + 2;
    } while (_Var4._M_head_impl != _Var5._M_head_impl);
  }
  SVar10.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)_Var4._M_head_impl;
  SVar10.size_ = (size_type_conflict)this;
  return SVar10;
}

Assistant:

SquareMatrix< T > eye( const int64_t size ) {
      SquareMatrix< T > mat( size , T(0) ) ;
      #pragma omp parallel for
      for ( int64_t i = 0; i < size; i++ ) {
        mat(i,i) = T(1) ;
      }
      return mat ;
    }